

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall logger::OutputWorker::Stop(OutputWorker *this)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> qlocker_1;
  system_error *anon_var_0;
  unique_lock<std::mutex> qlocker;
  lock_guard<std::mutex> locker;
  mutex_type *in_stack_ffffffffffffff98;
  mutex_type *__m;
  OutputWorker *in_stack_ffffffffffffffb0;
  mutex_type local_48;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffff98);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI[0xe]._M_owns);
  if (bVar1) {
    Flush(in_stack_ffffffffffffffb0);
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_RDI,SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
    std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffff98);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(in_RDI);
    std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10c027);
    bVar1 = std::thread::joinable((thread *)in_RDI);
    if (bVar1) {
      std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x10c046);
      std::thread::join();
    }
  }
  __m = &local_48;
  std::shared_ptr<std::thread>::shared_ptr((shared_ptr<std::thread> *)in_RDI,__m);
  std::shared_ptr<std::thread>::operator=
            ((shared_ptr<std::thread> *)in_RDI,(shared_ptr<std::thread> *)__m);
  std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)0x10c0d0);
  std::unique_lock<std::mutex>::unique_lock(in_RDI,__m);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10c10a);
  return;
}

Assistant:

void OutputWorker::Stop()
{
    std::lock_guard<std::mutex> locker(StartStopLock);

    if (Thread)
    {
#if defined(_WIN32)
        // If thread was force-terminated by something:
        if (WAIT_OBJECT_0 == ::WaitForSingleObject(ThreadNativeHandle, 0))
        {
            LOGGER_DEBUG_BREAK(); // Application force-terminated the thread
            return; // Abort shutdown...
        }
#endif // _WIN32

        Flush();

        Terminated = true;

        // Make sure that queue notification happens after termination flag is set
        {
            std::unique_lock<std::mutex> qlocker(QueueLock);
            QueueCondition.notify_all();
        }

        try
        {
            if (Thread->joinable())
                Thread->join();
        }
        catch (std::system_error& /*err*/)
        {
        }
    }
    Thread = nullptr;

    // Make sure that concurrent Flush() calls do not block
    {
        std::unique_lock<std::mutex> qlocker(QueueLock);
        FlushCondition.notify_all();
    }
}